

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fairness_test.cpp
# Opt level: O3

void __thiscall
FairMutexTest_FifoSched_Test<yamc::fair::timed_mutex>::TestBody
          (FairMutexTest_FifoSched_Test<yamc::fair::timed_mutex> *this)

{
  anon_class_24_3_d9b03587_for_f f;
  long lVar1;
  long lVar2;
  char *message;
  atomic<int> step;
  TypeParam mtx;
  duration<long,_std::ratio<1L,_1000L>_> local_158;
  duration<long,_std::ratio<1L,_1000L>_> local_150;
  internal local_148 [8];
  undefined8 *local_140;
  atomic<int> local_134;
  undefined8 *local_130;
  undefined8 **ppuStack_128;
  atomic<int> *local_120;
  undefined8 local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  condition_variable local_f8 [48];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 **local_a0;
  undefined8 **local_98;
  condition_variable local_80 [48];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  local_134.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  local_118 = 0;
  local_110 = (undefined8 *)operator_new(0x18);
  local_108 = local_110 + 3;
  *local_110 = 0;
  local_110[1] = 0;
  local_110[2] = 0;
  local_100 = local_108;
  std::condition_variable::condition_variable(local_f8);
  local_a8 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_a0 = &local_a0;
  local_98 = &local_a0;
  std::condition_variable::condition_variable(local_80);
  local_30 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_50 = 0;
  uStack_48 = 0;
  lVar1 = std::chrono::_V2::system_clock::now();
  local_130 = &local_118;
  f.mtx = (TypeParam *)&local_a0;
  f.phaser = (phaser *)local_130;
  f.step = &local_134;
  ppuStack_128 = &local_a0;
  local_120 = &local_134;
  yamc::test::
  task_runner<FairMutexTest_FifoSched_Test<yamc::fair::timed_mutex>::TestBody()::_lambda(unsigned_long)_1_>
            (3,f);
  local_150.__r = (rep)&DAT_00000578;
  lVar2 = std::chrono::_V2::system_clock::now();
  local_158.__r = (lVar2 - lVar1) / 1000;
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            (local_148,"std::chrono::milliseconds(200) * 7","sw.elapsed()",&local_150,&local_158);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    if (local_140 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_140;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/fairness_test.cpp"
               ,0x57,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if ((long *)local_150.__r != (long *)0x0) {
      (**(code **)(*(long *)local_150.__r + 8))();
    }
  }
  if (local_140 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_140 != local_140 + 2) {
      operator_delete((undefined8 *)*local_140);
    }
    operator_delete(local_140);
  }
  std::condition_variable::~condition_variable(local_80);
  std::condition_variable::~condition_variable(local_f8);
  if (local_110 != (undefined8 *)0x0) {
    operator_delete(local_110);
  }
  return;
}

Assistant:

TYPED_TEST(FairMutexTest, FifoSched)
{
  SETUP_STEPTEST;
  yamc::test::phaser phaser(3);
  TypeParam mtx;
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(3, [&](std::size_t id) {
    auto ph = phaser.get(id);
    switch (id) {
    case 0:
      EXPECT_TRUE(mtx.try_lock());
      EXPECT_STEP(1);
      ph.advance(2);  // p1-2
      ph.await();     // p3
      EXPECT_STEP(4);
      mtx.unlock();
      mtx.lock();
      EXPECT_STEP(7);
      mtx.unlock();
      break;
    case 1:
      ph.await();     // p1
      EXPECT_STEP(2);
      ph.advance(2);  // p2-3
      mtx.lock();
      EXPECT_STEP(5);
      mtx.unlock();
      break;
    case 2:
      ph.await();     // p1
      EXPECT_FALSE(mtx.try_lock());
      ph.await();     // p2
      EXPECT_STEP(3);
      ph.advance(1);  // p3
      mtx.lock();
      EXPECT_STEP(6);
      mtx.unlock();
      break;
    }
  });
  EXPECT_LE(TEST_TICKS * 7, sw.elapsed());
}